

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::InputAssemblyInstance::iterate
          (TestStatus *__return_storage_ptr__,InputAssemblyInstance *this)

{
  VkDevice *ppVVar1;
  TestLog *log;
  bool bVar2;
  VkResult VVar3;
  PrimitiveType primitive;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkQueue pVVar6;
  pointer puVar7;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  TextureFormat tcuColorFormat;
  TextureFormat tcuStencilFormat;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> nonIndexedVertices
  ;
  IVec3 local_614;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indicesRange;
  UVec4 local_3f8;
  SimpleAllocator allocator;
  ColorVertexShader vertexShader;
  Program program;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  VkSubmitInfo submitInfo;
  
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar6 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar3 = (*pDVar4->_vptr_DeviceInterface[0x14])(pDVar4,pVVar5,1,&this->m_fence);
  ::vk::checkResult(VVar3,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineInputAssemblyTests.cpp"
                    ,0x5a3);
  VVar3 = (*pDVar4->_vptr_DeviceInterface[2])
                    (pDVar4,pVVar6,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineInputAssemblyTests.cpp"
                    ,0x5a4);
  VVar3 = (*pDVar4->_vptr_DeviceInterface[0x16])
                    (pDVar4,pVVar5,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineInputAssemblyTests.cpp"
                    ,0x5a5);
  tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
  tcuStencilFormat.order = CHANNELORDER_LAST;
  tcuStencilFormat.type = CHANNELTYPE_LAST;
  rr::VertexShader::VertexShader(&vertexShader.super_VertexShader,2,2);
  vertexShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00cf1f60;
  *(undefined8 *)
   vertexShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  (vertexShader.super_VertexShader.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  vertexShader.super_VertexShader.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
  ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuStencilFormat);
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertexShader.super_VertexShader;
  program.fragmentShader = &fragmentShader.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &tcuColorFormat,&tcuStencilFormat,&program);
  primitive = mapVkPrimitiveTopology(this->m_primitiveTopology);
  ReferenceRenderer::getViewportState(&refRenderer);
  allocator.super_Allocator._vptr_Allocator = (_func_int **)0x100000000;
  allocator.m_vk = (DeviceInterface *)0x0;
  allocator.m_device._0_4_ = 1;
  allocator.m_device._4_2_ = 2;
  allocator.m_device._6_2_ = 0;
  rr::FragmentOperationState::FragmentOperationState
            ((FragmentOperationState *)&allocator.m_memProps);
  allocator.m_memProps.memoryTypes[0x13].heapIndex = 0x3f800000;
  allocator.m_memProps.memoryTypes[0x14] =
       (VkMemoryType)
       indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  allocator.m_memProps.memoryTypes[0x15] =
       (VkMemoryType)
       indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  allocator.m_memProps.memoryTypes[0x16] =
       (VkMemoryType)
       indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  allocator.m_memProps.memoryTypes[0x17].propertyFlags = 0x3f800000;
  allocator.m_memProps.memoryTypes[0x17].heapIndex._0_1_ = 0;
  allocator.m_memProps.memoryTypes[0x18].propertyFlags = 0xffffffff;
  allocator.m_memProps.memoryTypes[0x18].heapIndex = 0;
  allocator.m_device._4_2_ = 0;
  allocator.m_device._6_2_ = 0;
  if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    allocator.m_memProps.memoryTypes[0x13].heapIndex = 0x40400000;
  }
  if (this->m_primitiveRestartEnable == true) {
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar7 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar8 == puVar7) goto LAB_004ca435;
    uVar10 = 0;
    do {
      if ((-(uint)(this->m_indexType == VK_INDEX_TYPE_UINT32) | 0xffff) == puVar7[uVar10]) {
LAB_004ca2f4:
        nonIndexedVertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nonIndexedVertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nonIndexedVertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar9 = 0;
          do {
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&nonIndexedVertices,
                      (this->m_vertices).
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar9 < (ulong)((long)indicesRange.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)indicesRange.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        ReferenceRenderer::draw
                  (&refRenderer,(RenderState *)&allocator,primitive,&nonIndexedVertices);
        if (indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (nonIndexedVertices.
            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(nonIndexedVertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)nonIndexedVertices.
                                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)nonIndexedVertices.
                                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        puVar7 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar8 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar9 = (long)puVar8 - (long)puVar7 >> 2;
      }
      else {
        if (indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&indicesRange,
                     (iterator)
                     indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,puVar7 + uVar10);
          puVar7 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar8 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = puVar7[uVar10];
          indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar9 = (long)puVar8 - (long)puVar7 >> 2;
        if (uVar10 == uVar9 - 1) goto LAB_004ca2f4;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar9);
  }
  else {
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar7 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar7) {
      uVar10 = 0;
      do {
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )&indicesRange,
                  (this->m_vertices).
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_start + puVar7[uVar10]);
        uVar10 = uVar10 + 1;
        puVar7 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(this->m_indices).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2
                               ));
    }
    ReferenceRenderer::draw
              (&refRenderer,(RenderState *)&allocator,primitive,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &indicesRange);
  }
  if (indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indicesRange.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)indicesRange.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_004ca435:
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar6 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&indicesRange,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&allocator,pDVar4,pVVar5,(VkPhysicalDeviceMemoryProperties *)&indicesRange);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &indicesRange,pDVar4,pVVar5,pVVar6,queueFamilyIndex,&allocator.super_Allocator
                      ,(VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                                m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)
       indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&indicesRange)
  ;
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&indicesRange,&refRenderer);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&nonIndexedVertices,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  local_3f8.m_data[0] = 2;
  local_3f8.m_data[1] = 2;
  local_3f8.m_data[2] = 2;
  local_3f8.m_data[3] = 2;
  local_614.m_data[0] = 1;
  local_614.m_data[1] = 1;
  local_614.m_data[2] = 0;
  bVar2 = tcu::intThresholdPositionDeviationCompare
                    (log,"IntImageCompare","Image comparison",
                     (ConstPixelBufferAccess *)&indicesRange,
                     (ConstPixelBufferAccess *)&nonIndexedVertices,&local_3f8,&local_614,true,
                     COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  ppVVar1 = &allocator.m_device;
  allocator.super_Allocator._vptr_Allocator = (_func_int **)ppVVar1;
  if (bVar2) {
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1e;
    allocator.super_Allocator._vptr_Allocator =
         (_func_int **)std::__cxx11::string::_M_create((ulong *)&allocator,(ulong)&indicesRange);
    allocator.m_device._0_4_ =
         SUB84(indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    allocator.m_device._4_2_ =
         (undefined2)
         ((ulong)indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 0x20);
    allocator.m_device._6_2_ =
         (undefined2)
         ((ulong)indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 0x30);
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 0xe),"atches r",8);
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 0x16),"eference",8);
    *(undefined4 *)allocator.super_Allocator._vptr_Allocator = 0x75736552;
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 4),"lt i",4);
    *(undefined4 *)(allocator.super_Allocator._vptr_Allocator + 1) = 0x6567616d;
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 0xc)," mat",4);
    allocator.m_vk =
         (DeviceInterface *)
         indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)allocator.super_Allocator._vptr_Allocator +
             (long)indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start) = '\0';
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               allocator.super_Allocator._vptr_Allocator,
               (char *)((long)indicesRange.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       (long)allocator.super_Allocator._vptr_Allocator));
  }
  else {
    allocator.m_device._0_4_ = 0x67616d49;
    allocator.m_device._4_2_ = 0x2065;
    allocator.m_device._6_2_ = 0x696d;
    allocator.m_memProps._0_6_ = 0x686374616d73;
    allocator.m_vk = (DeviceInterface *)0xe;
    allocator.m_memProps.memoryTypes[0].propertyFlags._2_1_ = 0;
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,ppVVar1);
  }
  if ((VkDevice *)allocator.super_Allocator._vptr_Allocator != ppVVar1) {
    operator_delete(allocator.super_Allocator._vptr_Allocator,
                    CONCAT26(allocator.m_device._6_2_,
                             CONCAT24(allocator.m_device._4_2_,allocator.m_device._0_4_)) + 1);
  }
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus InputAssemblyInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	return verifyImage();
}